

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_serialize_script(parser_state_t *state,anm_script_t *script)

{
  anm_instr_t instr_00;
  void *__ptr;
  anm_instr_t *data;
  list_node_t *local_40;
  list_node_t *node_1;
  label_t *label;
  anm_instr_t *raw_instr;
  list_node_t *node;
  thanm_instr_t *instr;
  anm_script_t *script_local;
  parser_state_t *state_local;
  
  for (raw_instr = (anm_instr_t *)(script->instrs).head; raw_instr != (anm_instr_t *)0x0;
      raw_instr = *(anm_instr_t **)raw_instr) {
    instr_00 = raw_instr[2];
    data = anm_serialize_instr(state,(thanm_instr_t *)instr_00,script);
    if (data != (anm_instr_t *)0x0) {
      list_append_new(&script->raw_instrs,data);
    }
    thanm_instr_free((thanm_instr_t *)instr_00);
  }
  list_free_nodes(&script->instrs);
  for (local_40 = (script->labels).head; local_40 != (list_node_t *)0x0; local_40 = local_40->next)
  {
    __ptr = local_40->data;
    free(*(void **)((long)__ptr + 8));
    free(__ptr);
  }
  list_free_nodes(&script->labels);
  return;
}

Assistant:

static void
anm_serialize_script(
    parser_state_t* state,
    anm_script_t* script
) {
    thanm_instr_t* instr;
    list_for_each(&script->instrs, instr) {
        anm_instr_t* raw_instr = anm_serialize_instr(state, instr, script);
        if (raw_instr != NULL)
            list_append_new(&script->raw_instrs, raw_instr);
        thanm_instr_free(instr);
    }
    list_free_nodes(&script->instrs);

    label_t* label;
    list_for_each(&script->labels, label) {
        free(label->name);
        free(label);
    }
    list_free_nodes(&script->labels);
}